

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O2

void __thiscall
snestistics::EmulateRegisters::write_byte
          (EmulateRegisters *this,uint32_t address,uint8_t v,MemoryAccessType reason)

{
  byte bVar1;
  uint32_t r;
  
  r = remap(this,address);
  if ((r & 0xffffff00) == 0x2100) {
    special_write_a(this,r,v);
  }
  else {
    if (0x2ff < r - 0x4200) {
      bVar1 = 0;
      goto LAB_001347da;
    }
    special_write_b(this,r,v);
  }
  bVar1 = 1;
LAB_001347da:
  if (this->_write_function != (memoryAccessFunc)0x0) {
    (*this->_write_function)(this->_callback_context,address,r,(uint32_t)v,1,reason);
  }
  if (!(bool)((r & 0xfe0000) != 0x7e0000 & (bVar1 ^ 1))) {
    this->_memory[r] = v;
  }
  return;
}

Assistant:

inline void write_byte(uint32_t address, uint8_t v, MemoryAccessType reason) {
		uint32_t r = remap(address);

		bool sw = false;

		if (r >= 0x002100 && r <= 0x0021FF) {
			special_write_a(r, v);
			sw = true;
		} else if (r >= 0x004200 && r <= 0x0044ff) {
			special_write_b(r, v);
			sw = true;
		}

		if(_write_function)
			(*_write_function)(_callback_context, address, r, v, 1, reason);

		// Don't allow writing to memory mapped registers, SRAM etc...
		// NOTE: Remap remaps to 7E when needed
		uint8_t bank = r>>16;
		if (bank != 0x7E && bank != 0x7F && !sw)
			return;

		_memory[r] = v;
	}